

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O3

longlong NULLC::StrToLong(NULLCArray str)

{
  char cVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  char *pcVar5;
  
  pcVar5 = str.ptr;
  if (pcVar5 == (char *)0x0) {
    return 0;
  }
  cVar1 = *pcVar5;
  uVar2 = (int)pcVar5[cVar1 == '-'] - 0x30;
  if (uVar2 < 10) {
    pcVar5 = pcVar5 + (cVar1 == '-');
    lVar4 = 0;
    do {
      pcVar5 = pcVar5 + 1;
      lVar4 = (ulong)uVar2 + lVar4 * 10;
      uVar2 = (int)*pcVar5 - 0x30;
    } while (uVar2 < 10);
  }
  else {
    lVar4 = 0;
  }
  lVar3 = -lVar4;
  if (cVar1 != '-') {
    lVar3 = lVar4;
  }
  return lVar3;
}

Assistant:

long long NULLC::StrToLong(NULLCArray str)
{
	if(!str.ptr)
		return 0;

	const char *p = str.ptr;

	bool negative = *p == '-';
	if(negative)
		p++;

	unsigned long long res = 0;
	while(unsigned(*p - '0') < 10)
		res = res * 10 + unsigned(*p++ - '0');

	return res * (negative ? -1 : 1);
}